

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

string * s2textformat::ToString_abi_cxx11_(S2PointLoopSpan loop)

{
  bool bVar1;
  pointer v;
  size_type sVar2;
  string *this;
  allocator local_21;
  undefined1 local_20 [8];
  S2PointLoopSpan loop_local;
  string *out;
  
  local_20 = (undefined1  [8])loop.super_S2PointSpan.len_;
  this = (string *)loop.super_S2PointSpan.ptr_;
  loop_local.super_S2PointSpan.len_ = (size_type)this;
  bVar1 = absl::Span<const_Vector3<double>_>::empty((Span<const_Vector3<double>_> *)local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"full",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::string(this);
    v = absl::Span<const_Vector3<double>_>::data((Span<const_Vector3<double>_> *)local_20);
    sVar2 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)local_20);
    AppendVertices(v,(int)sVar2,(string *)this);
  }
  return this;
}

Assistant:

string ToString(S2PointLoopSpan loop) {
  // S2Shape represents the full loop as a loop with no vertices.
  // There is no representation of the empty loop.
  if (loop.empty()) {
    return "full";
  }
  string out;
  AppendVertices(loop.data(), loop.size(), &out);
  return out;
}